

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumerate_tests.cpp
# Opt level: O2

void __thiscall
omp_enumerate_iterator_for_loop_type_Test::omp_enumerate_iterator_for_loop_type_Test
          (omp_enumerate_iterator_for_loop_type_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00185aa8;
  return;
}

Assistant:

TEST(omp_enumerate, iterator_for_loop_type) {
  std::vector expecting = {0, 1, 2, 3, 4, 5, 6, 7, 8, 9};

  auto enumeration = omp::enumerate(expecting);

  for (auto it = std::begin(enumeration); it != std::end(enumeration); ++it)
    it->second += 1;

  for (auto it = std::begin(enumeration); it != std::end(enumeration); ++it)
    ASSERT_EQ(it->first + 1, it->second);
}